

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
UnsafeArenaExtractSubrange
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int start,int num,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **elements)

{
  Nullable<const_char_*> __dest;
  int iVar1;
  int iVar2;
  char *pcVar3;
  LogMessage *pLVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar5;
  LogMessage local_80;
  Voidify local_69;
  Nullable<const_char_*> local_68;
  Nullable<const_char_*> absl_log_internal_check_op_result_2;
  Voidify local_49;
  Nullable<const_char_*> local_48;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  Voidify local_29;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **elements_local;
  int num_local;
  int start_local;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)elements;
  elements_local._0_4_ = num;
  elements_local._4_4_ = start;
  _num_local = this;
  iVar1 = absl::lts_20250127::log_internal::GetReferenceableValue(start);
  iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_28 = absl::lts_20250127::log_internal::Check_GEImpl(iVar1,iVar2,"start >= 0");
  if (local_28 != (Nullable<const_char_*>)0x0) {
    pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_28);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_1,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x5be,pcVar3);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                       ((LogMessage *)&absl_log_internal_check_op_result_1);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_1);
  }
  iVar1 = absl::lts_20250127::log_internal::GetReferenceableValue((int)elements_local);
  iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_48 = absl::lts_20250127::log_internal::Check_GEImpl(iVar1,iVar2,"num >= 0");
  if (local_48 != (Nullable<const_char_*>)0x0) {
    pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_48);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_2,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x5bf,pcVar3);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                       ((LogMessage *)&absl_log_internal_check_op_result_2);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_2);
  }
  iVar1 = absl::lts_20250127::log_internal::GetReferenceableValue
                    (elements_local._4_4_ + (int)elements_local);
  iVar2 = size(this);
  iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(iVar2);
  local_68 = absl::lts_20250127::log_internal::Check_LEImpl(iVar1,iVar2,"start + num <= size()");
  __dest = absl_log_internal_check_op_result;
  if (local_68 != (Nullable<const_char_*>)0x0) {
    pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_68);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x5c0,pcVar3);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_80);
  }
  if (0 < (int)elements_local) {
    if (absl_log_internal_check_op_result != (Nullable<const_char_*>)0x0) {
      ppbVar5 = data(this);
      memcpy(__dest,ppbVar5 + elements_local._4_4_,(long)(int)elements_local << 3);
    }
    internal::RepeatedPtrFieldBase::CloseGap
              (&this->super_RepeatedPtrFieldBase,elements_local._4_4_,(int)elements_local);
  }
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::UnsafeArenaExtractSubrange(
    int start, int num, Element** elements) {
  ABSL_DCHECK_GE(start, 0);
  ABSL_DCHECK_GE(num, 0);
  ABSL_DCHECK_LE(start + num, size());

  if (num > 0) {
    // Save the values of the removed elements if requested.
    if (elements != nullptr) {
      memcpy(elements, data() + start, num * sizeof(Element*));
    }
    CloseGap(start, num);
  }
}